

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int event_del_nolock_(event *ev,int blocking)

{
  void *lock_;
  event_base *base;
  short *psVar1;
  unsigned_long uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  unsigned_long uVar6;
  event_debug_entry *peVar7;
  undefined8 uVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  undefined1 local_48 [24];
  
  if (event_debug_logging_mask_ != 0) {
    event_debugx_("event_del: %p (fd %d), callback %p",ev,(ulong)(uint)ev->ev_fd,
                  (ev->ev_evcallback).evcb_cb_union.evcb_callback);
  }
  if (ev->ev_base == (event_base *)0x0) {
    iVar4 = -1;
  }
  else {
    lock_ = ev->ev_base->th_base_lock;
    if (((lock_ != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
       (iVar4 = evthread_is_debug_lock_held_(lock_), iVar4 == 0)) {
      pcVar9 = "evthread_is_debug_lock_held_((ev->ev_base)->th_base_lock)";
      pcVar10 = "event_del_nolock_";
      uVar8 = 0xb09;
LAB_00263214:
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                 ,uVar8,pcVar9,pcVar10);
    }
    uVar3 = (ev->ev_evcallback).evcb_flags;
    if ((uVar3 & 0x40) != 0 && blocking != 3) {
      return 0;
    }
    if (0xff < uVar3) {
      pcVar9 = "!(ev->ev_flags & ~EVLIST_ALL)";
      pcVar10 = "event_del_nolock_";
      uVar8 = 0xb14;
      goto LAB_00263214;
    }
    base = ev->ev_base;
    if ((((ev->ev_events & 8) != 0) && ((ev->ev_).ev_signal.ev_ncalls != 0)) &&
       (psVar1 = (ev->ev_).ev_signal.ev_pncalls, psVar1 != (short *)0x0)) {
      *psVar1 = 0;
      uVar3 = (ev->ev_evcallback).evcb_flags;
    }
    if ((uVar3 & 1) != 0) {
      event_queue_remove_timeout(base,ev);
      uVar3 = (ev->ev_evcallback).evcb_flags;
    }
    if ((uVar3 & 8) == 0) {
      if ((uVar3 & 0x20) != 0) {
        event_queue_remove_active_later(base,&ev->ev_evcallback);
      }
    }
    else {
      event_queue_remove_active(base,&ev->ev_evcallback);
    }
    uVar3 = (ev->ev_evcallback).evcb_flags;
    iVar4 = 0;
    bVar13 = false;
    if ((uVar3 & 2) != 0) {
      if ((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) {
        iVar4 = evthread_is_debug_lock_held_(base->th_base_lock);
        if (iVar4 == 0) {
          pcVar9 = "evthread_is_debug_lock_held_((base)->th_base_lock)";
          pcVar10 = "event_queue_remove_inserted";
          uVar8 = 0xc9d;
          goto LAB_00263214;
        }
        uVar3 = (ev->ev_evcallback).evcb_flags;
      }
      if ((uVar3 & 2) == 0) {
        uVar11 = ev->ev_fd;
        pcVar10 = "%s: %p(fd %d) not on queue %x";
        pcVar9 = "event_queue_remove_inserted";
        iVar4 = 1;
        uVar12 = 2;
        goto LAB_00263234;
      }
      base->event_count = base->event_count - (uint)((uVar3 & 0x10) == 0);
      psVar1 = &(ev->ev_evcallback).evcb_flags;
      *(byte *)psVar1 = (byte)*psVar1 & 0xfd;
      if ((ev->ev_events & 0x86) == 0) {
        iVar5 = evmap_signal_del_(base,ev->ev_fd,ev);
      }
      else {
        iVar5 = evmap_io_del_(base,ev->ev_fd,ev);
      }
      bVar13 = iVar5 == 1;
      iVar4 = 0;
      if (!bVar13) {
        iVar4 = iVar5;
      }
      if ((base->virtual_event_count < 1) && (base->event_count < 1)) {
        bVar13 = base->event_count_active == 0 || iVar5 == 1;
      }
    }
    if ((((bool)(evthread_id_fn_ != (_func_unsigned_long *)0x0 & iVar4 != -1 & bVar13)) &&
        (base->running_loop != 0)) &&
       (uVar2 = base->th_owner_id, uVar6 = (*evthread_id_fn_)(), uVar2 != uVar6)) {
      evthread_notify_base(base);
    }
    if (event_debug_mode_on_ != 0) {
      peVar7 = (event_debug_entry *)event_debug_map_lock_;
      local_48._8_8_ = ev;
      if (event_debug_map_lock_ != (void *)0x0) {
        (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
      }
      peVar7 = event_debug_map_HT_FIND((event_debug_map *)local_48,peVar7);
      if (peVar7 == (event_debug_entry *)0x0) {
        uVar11 = (uint)ev->ev_events;
        uVar12 = (ulong)(uint)ev->ev_fd;
        pcVar10 = "%s: noting a del on a non-setup event %p (events: 0x%x, fd: %d, flags: 0x%x)";
        pcVar9 = "event_debug_note_del_";
        iVar4 = -0x21522153;
LAB_00263234:
        event_errx(iVar4,pcVar10,pcVar9,ev,(ulong)uVar11,uVar12);
      }
      peVar7->field_0x10 = peVar7->field_0x10 & 0xfe;
      if (event_debug_map_lock_ != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
      }
    }
    event_debug_mode_too_late = 1;
    if (((blocking != 0) &&
        (evthread_id_fn_ != (_func_unsigned_long *)0x0 && (event *)base->current_event == ev)) &&
       ((uVar2 = base->th_owner_id, uVar6 = (*evthread_id_fn_)(), uVar2 != uVar6 &&
        ((blocking == 1 || ((ev->ev_events & 0x40) == 0)))))) {
      base->current_event_waiters = base->current_event_waiters + 1;
      if (base->current_event_cond != (void *)0x0) {
        (*evthread_cond_fns_.wait_condition)
                  (base->current_event_cond,base->th_base_lock,(timeval *)0x0);
      }
    }
  }
  return iVar4;
}

Assistant:

int
event_del_nolock_(struct event *ev, int blocking)
{
	struct event_base *base;
	int res = 0, notify = 0;

	event_debug(("event_del: %p (fd "EV_SOCK_FMT"), callback %p",
		ev, EV_SOCK_ARG(ev->ev_fd), ev->ev_callback));

	/* An event without a base has not been added */
	if (ev->ev_base == NULL)
		return (-1);

	EVENT_BASE_ASSERT_LOCKED(ev->ev_base);

	if (blocking != EVENT_DEL_EVEN_IF_FINALIZING) {
		if (ev->ev_flags & EVLIST_FINALIZING) {
			/* XXXX Debug */
			return 0;
		}
	}

	base = ev->ev_base;

	EVUTIL_ASSERT(!(ev->ev_flags & ~EVLIST_ALL));

	/* See if we are just active executing this event in a loop */
	if (ev->ev_events & EV_SIGNAL) {
		if (ev->ev_ncalls && ev->ev_pncalls) {
			/* Abort loop */
			*ev->ev_pncalls = 0;
		}
	}

	if (ev->ev_flags & EVLIST_TIMEOUT) {
		/* NOTE: We never need to notify the main thread because of a
		 * deleted timeout event: all that could happen if we don't is
		 * that the dispatch loop might wake up too early.  But the
		 * point of notifying the main thread _is_ to wake up the
		 * dispatch loop early anyway, so we wouldn't gain anything by
		 * doing it.
		 */
		event_queue_remove_timeout(base, ev);
	}

	if (ev->ev_flags & EVLIST_ACTIVE)
		event_queue_remove_active(base, event_to_event_callback(ev));
	else if (ev->ev_flags & EVLIST_ACTIVE_LATER)
		event_queue_remove_active_later(base, event_to_event_callback(ev));

	if (ev->ev_flags & EVLIST_INSERTED) {
		event_queue_remove_inserted(base, ev);
		if (ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED))
			res = evmap_io_del_(base, ev->ev_fd, ev);
		else
			res = evmap_signal_del_(base, (int)ev->ev_fd, ev);
		if (res == 1) {
			/* evmap says we need to notify the main thread. */
			notify = 1;
			res = 0;
		}
		/* If we do not have events, let's notify event base so it can
		 * exit without waiting */
		if (!event_haveevents(base) && !N_ACTIVE_CALLBACKS(base))
			notify = 1;
	}

	/* if we are not in the right thread, we need to wake up the loop */
	if (res != -1 && notify && EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);

	event_debug_note_del_(ev);

	/* If the main thread is currently executing this event's callback,
	 * and we are not the main thread, then we want to wait until the
	 * callback is done before returning. That way, when this function
	 * returns, it will be safe to free the user-supplied argument.
	 */
#ifndef EVENT__DISABLE_THREAD_SUPPORT
	if (blocking != EVENT_DEL_NOBLOCK &&
	    base->current_event == event_to_event_callback(ev) &&
	    !EVBASE_IN_THREAD(base) &&
	    (blocking == EVENT_DEL_BLOCK || !(ev->ev_events & EV_FINALIZE))) {
		++base->current_event_waiters;
		EVTHREAD_COND_WAIT(base->current_event_cond, base->th_base_lock);
	}
#endif

	return (res);
}